

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_cast_expression.cpp
# Opt level: O1

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::AddCastToTypeInternal
          (duckdb *this,
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr,
          LogicalType *target_type,CastFunctionSet *cast_functions,GetCastFunctionInput *get_input,
          bool try_cast)

{
  shared_ptr<duckdb::BoundParameterData,_true> *this_00;
  ExpressionClass EVar1;
  LogicalTypeId LVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  init_cast_local_state_t p_Var3;
  unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true> uVar4;
  bool bVar5;
  pointer pEVar6;
  BoundParameterExpression *pBVar7;
  BoundParameterData *pBVar8;
  BoundDefaultExpression *pBVar9;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var10;
  shared_ptr<duckdb::ExtraTypeInfo,_true> *other;
  pointer *__ptr;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  BoundCastInfo cast_function;
  BoundCastInfo local_78;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_60;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  BoundCastInfo local_48;
  
  pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (expr);
  EVar1 = (pEVar6->super_BaseExpression).expression_class;
  pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (expr);
  if (EVar1 == BOUND_PARAMETER) {
    pBVar7 = BaseExpression::Cast<duckdb::BoundParameterExpression>(&pEVar6->super_BaseExpression);
    bVar5 = LogicalType::IsValid(target_type);
    if (!bVar5) {
      LogicalType::LogicalType((LogicalType *)&local_78,INVALID);
      pBVar8 = shared_ptr<duckdb::BoundParameterData,_true>::operator->(&pBVar7->parameter_data);
LAB_011a55bf:
      uVar4.super_unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>.
      _M_t.super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>.
      super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl =
           (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>)
           (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>)
           local_78.cast_data;
      p_Var3 = local_78.init_local_state;
      (pBVar8->return_type).id_ = (LogicalTypeId)local_78.function;
      (pBVar8->return_type).physical_type_ = local_78.function._1_1_;
      uVar11 = *(undefined4 *)
                &(pBVar8->return_type).type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      uVar12 = *(undefined4 *)
                ((long)&(pBVar8->return_type).type_info_.internal.
                        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                + 4);
      uVar13 = *(undefined4 *)
                &(pBVar8->return_type).type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
      uVar14 = *(undefined4 *)
                ((long)&(pBVar8->return_type).type_info_.internal.
                        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi + 4);
      (pBVar8->return_type).type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      (pBVar8->return_type).type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_78.init_local_state = (init_cast_local_state_t)0x0;
      local_78.cast_data.
      super_unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t.
      super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t
      .super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>.
      super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl =
           (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>)
           (__uniq_ptr_data<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true,_true>
            )0x0;
      this_01 = (pBVar8->return_type).type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
      (pBVar8->return_type).type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)p_Var3;
      (pBVar8->return_type).type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           uVar4.
           super_unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t
           .
           super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>
           .super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl;
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        local_58 = uVar11;
        uStack_54 = uVar12;
        uStack_50 = uVar13;
        uStack_4c = uVar14;
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
        uVar11 = local_58;
        uVar12 = uStack_54;
        uVar13 = uStack_50;
        uVar14 = uStack_4c;
      }
      uVar4.super_unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>.
      _M_t.super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>.
      super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl =
           (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>)
           (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>)
           local_78.cast_data;
      local_78.init_local_state = (init_cast_local_state_t)CONCAT44(uVar12,uVar11);
      local_78.cast_data.
      super_unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t.
      super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t
      .super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>.
      super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl._4_4_ = uVar14;
      local_78.cast_data.
      super_unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t.
      super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t
      .super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>.
      super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl._0_4_ = uVar13;
      if ((__uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>)
          uVar4.super_unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>.
          _M_t.
          super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>
          .super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>)0x0)
      {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   uVar4.
                   super_unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>
                   ._M_t.
                   super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>
                   .super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl);
      }
      LogicalType::~LogicalType((LogicalType *)&local_78);
LAB_011a5621:
      if (&(pBVar7->super_Expression).return_type != target_type) {
        (pBVar7->super_Expression).return_type.id_ = target_type->id_;
        (pBVar7->super_Expression).return_type.physical_type_ = target_type->physical_type_;
        shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                  (&(pBVar7->super_Expression).return_type.type_info_,&target_type->type_info_);
      }
      _Var10._M_head_impl =
           (expr->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
           _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
           _M_t.
           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
           super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      goto LAB_011a56cc;
    }
    this_00 = &pBVar7->parameter_data;
    pBVar8 = shared_ptr<duckdb::BoundParameterData,_true>::operator->(this_00);
    if ((pBVar8->return_type).id_ == INVALID) {
      if (&(pBVar7->super_Expression).return_type != target_type) {
        (pBVar7->super_Expression).return_type.id_ = target_type->id_;
        (pBVar7->super_Expression).return_type.physical_type_ = target_type->physical_type_;
        other = &target_type->type_info_;
LAB_011a56bf:
        shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                  (&(pBVar7->super_Expression).return_type.type_info_,other);
      }
    }
    else {
      pBVar8 = shared_ptr<duckdb::BoundParameterData,_true>::operator->(this_00);
      LVar2 = (pBVar8->return_type).id_;
      pBVar8 = shared_ptr<duckdb::BoundParameterData,_true>::operator->(this_00);
      if (LVar2 == UNKNOWN) {
        if (&pBVar8->return_type != target_type) {
          (pBVar8->return_type).id_ = target_type->id_;
          (pBVar8->return_type).physical_type_ = target_type->physical_type_;
          shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                    (&(pBVar8->return_type).type_info_,&target_type->type_info_);
        }
        goto LAB_011a5621;
      }
      bVar5 = LogicalType::operator==(&pBVar8->return_type,target_type);
      if (!bVar5) {
        LogicalType::LogicalType((LogicalType *)&local_78,INVALID);
        pBVar8 = shared_ptr<duckdb::BoundParameterData,_true>::operator->(this_00);
        goto LAB_011a55bf;
      }
      pBVar8 = shared_ptr<duckdb::BoundParameterData,_true>::operator->(this_00);
      if (&(pBVar7->super_Expression).return_type != &pBVar8->return_type) {
        (pBVar7->super_Expression).return_type.id_ = (pBVar8->return_type).id_;
        (pBVar7->super_Expression).return_type.physical_type_ = (pBVar8->return_type).physical_type_
        ;
        other = &(pBVar8->return_type).type_info_;
        goto LAB_011a56bf;
      }
    }
  }
  else {
    if ((pEVar6->super_BaseExpression).expression_class == BOUND_DEFAULT) {
      pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(expr);
      pBVar9 = BaseExpression::Cast<duckdb::BoundDefaultExpression>(&pEVar6->super_BaseExpression);
      if (&(pBVar9->super_Expression).return_type != target_type) {
        (pBVar9->super_Expression).return_type.id_ = target_type->id_;
        (pBVar9->super_Expression).return_type.physical_type_ = target_type->physical_type_;
        shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                  (&(pBVar9->super_Expression).return_type.type_info_,&target_type->type_info_);
      }
    }
    bVar5 = LogicalType::IsValid(target_type);
    if (bVar5) {
      pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(expr);
      CastFunctionSet::GetCastFunction
                (&local_78,cast_functions,&pEVar6->return_type,target_type,get_input);
      local_60._M_head_impl =
           (expr->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
           _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
           _M_t.
           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
           super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      (expr->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
      super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
      local_48.init_local_state = local_78.init_local_state;
      local_48.cast_data.
      super_unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t.
      super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t
      .super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>.
      super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl =
           local_78.cast_data.
           super_unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t
           .
           super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>
           .super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl;
      local_78.cast_data.
      super_unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t.
      super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t
      .super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>.
      super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl =
           (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>)
           (__uniq_ptr_data<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true,_true>
            )0x0;
      AddCastExpressionInternal
                (this,(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)&local_60,target_type,&local_48,try_cast);
      if (local_48.cast_data.
          super_unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t.
          super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>.
          _M_t.
          super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>
          .super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl !=
          (__uniq_ptr_data<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true,_true>
           )0x0) {
        (**(code **)(*(long *)local_48.cast_data.
                              super_unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>
                              ._M_t.
                              super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>
                              .super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl +
                    8))();
      }
      local_48.cast_data.
      super_unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t.
      super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t
      .super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>.
      super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl =
           (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>)
           (__uniq_ptr_data<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true,_true>
            )0x0;
      if (local_60._M_head_impl != (Expression *)0x0) {
        (*((local_60._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      local_60._M_head_impl = (Expression *)0x0;
      if (local_78.cast_data.
          super_unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t.
          super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>.
          _M_t.
          super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>
          .super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl ==
          (__uniq_ptr_data<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true,_true>
           )0x0) {
        return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
      }
      (**(code **)(*(long *)local_78.cast_data.
                            super_unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>
                            ._M_t.
                            super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>
                            .super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl + 8)
      )();
      return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
    }
  }
  _Var10._M_head_impl =
       (expr->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
       super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
LAB_011a56cc:
  *(Expression **)this = _Var10._M_head_impl;
  (expr->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> AddCastToTypeInternal(unique_ptr<Expression> expr, const LogicalType &target_type,
                                             CastFunctionSet &cast_functions, GetCastFunctionInput &get_input,
                                             bool try_cast) {
	D_ASSERT(expr);
	if (expr->GetExpressionClass() == ExpressionClass::BOUND_PARAMETER) {
		auto &parameter = expr->Cast<BoundParameterExpression>();
		if (!target_type.IsValid()) {
			// invalidate the parameter
			parameter.parameter_data->return_type = LogicalType::INVALID;
			parameter.return_type = target_type;
			return expr;
		}
		if (parameter.parameter_data->return_type.id() == LogicalTypeId::INVALID) {
			// we don't know the type of this parameter
			parameter.return_type = target_type;
			return expr;
		}
		if (parameter.parameter_data->return_type.id() == LogicalTypeId::UNKNOWN) {
			// prepared statement parameter cast - but there is no type, convert the type
			parameter.parameter_data->return_type = target_type;
			parameter.return_type = target_type;
			return expr;
		}
		// prepared statement parameter already has a type
		if (parameter.parameter_data->return_type == target_type) {
			// this type! we are done
			parameter.return_type = parameter.parameter_data->return_type;
			return expr;
		}
		// invalidate the type
		parameter.parameter_data->return_type = LogicalType::INVALID;
		parameter.return_type = target_type;
		return expr;
	} else if (expr->GetExpressionClass() == ExpressionClass::BOUND_DEFAULT) {
		D_ASSERT(target_type.IsValid());
		auto &def = expr->Cast<BoundDefaultExpression>();
		def.return_type = target_type;
	}
	if (!target_type.IsValid()) {
		return expr;
	}

	auto cast_function = cast_functions.GetCastFunction(expr->return_type, target_type, get_input);
	return AddCastExpressionInternal(std::move(expr), target_type, std::move(cast_function), try_cast);
}